

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sign.c
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint val;
  uint uVar6;
  uint uVar7;
  int extraout_EAX;
  EVP_PKEY *pEVar8;
  EVP_PKEY_CTX *pEVar9;
  BIO_METHOD *type;
  BIO *bp;
  long lVar10;
  long lVar11;
  EC_KEY *key;
  EC_GROUP *group;
  uchar *puVar12;
  uchar *puVar13;
  uchar *sig;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  test_sign *ptVar17;
  char *pcVar18;
  bool local_99;
  EVP_PKEY *pkey;
  EVP_PKEY *priv_key;
  byte local_88;
  byte local_87;
  byte local_86;
  byte local_85;
  uint local_84;
  size_t local_80;
  EVP_PKEY *key2;
  ulong local_70;
  uint local_64;
  uchar *kptr;
  uint local_54;
  test_sign *local_50;
  uchar *local_48;
  uchar *local_40;
  uchar *tptr;
  
  OPENSSL_init_crypto(0x4c,0);
  ptVar17 = test_signs;
  uVar15 = 0;
  while( true ) {
    uVar7 = 0xffffffff;
    if (ptVar17->name == (char *)0x0) {
      pcVar18 = "\x1b[0;31m= Some tests FAILED!\x1b[m";
      if (uVar15 == 0) {
        pcVar18 = "\x1b[0;32m= All tests passed!\x1b[m";
      }
      puts(pcVar18);
      return uVar15;
    }
    uVar1 = ptVar17->bits;
    printf("\x1b[1;34mTest %s:\x1b[m\n");
    if (uVar1 == 0x100) break;
    if (uVar1 == 0x200) {
      uVar14 = 0x3d4;
      pcVar18 = "gost2012_512";
      goto LAB_001024d8;
    }
LAB_00102d69:
    uVar15 = uVar15 | uVar7;
    ptVar17 = ptVar17 + 1;
  }
  uVar14 = 0x3d3;
  pcVar18 = "gost2012_256";
LAB_001024d8:
  local_70 = uVar1;
  local_64 = uVar15;
  pEVar8 = EVP_PKEY_new();
  pkey = (EVP_PKEY *)pEVar8;
  if (pEVar8 == (EVP_PKEY *)0x0) {
LAB_00102e3d:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("pkey = EVP_PKEY_new()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x83);
LAB_00102e64:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_keygen_init(ctx)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x87);
LAB_00102e8b:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_CTX_ctrl(ctx, type, -1, EVP_PKEY_CTRL_GOST_PARAMSET, t->nid, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x88);
LAB_00102eb2:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_PKEY_CTX_new(pkey, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x86);
LAB_00102ed9:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("key1 = EVP_PKEY_new()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe3);
LAB_00102f00:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("i2d_PrivateKey_bio(bp, priv_key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xa1);
LAB_00102f27:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("sig = OPENSSL_malloc(siglen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x113);
LAB_00102f4e:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("BIO_reset(bp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xb6);
LAB_00102f75:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("d2i_PrivateKey(type, &pkey, &tptr, klen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xd9);
LAB_00102f9c:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("BIO_reset(bp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xa0);
LAB_00102fc3:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_CTX_ctrl_str(ctx1, \"paramset\", t->paramset)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe8);
LAB_00102fea:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("d2i_PrivateKey_ex_bio(bp, &pkey, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xad);
LAB_00103011:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("klen = i2d_PrivateKey(priv_key, &kptr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xd6);
LAB_00103038:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("PEM_read_bio_PrivateKey(bp, &pkey, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x97);
LAB_0010305f:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_keygen_init(ctx1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe7);
LAB_00103086:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("i2d_PrivateKey_bio(bp, priv_key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xac);
LAB_001030ad:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_sign_init(ctx)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x119);
LAB_001030d4:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("OSSL_STORE_eof(cts)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xc1);
LAB_001030fb:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("PEM_write_bio_PrivateKey(bp, priv_key, NULL, NULL, 0, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x95);
LAB_00103122:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx1 = EVP_PKEY_CTX_new(key1, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe6);
LAB_00103149:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("BIO_reset(bp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xab);
LAB_00103170:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_PKEY_CTX_new(priv_key, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x116);
LAB_00103197:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("cts = OSSL_STORE_attach(bp, \"file\", NULL, NULL, NULL, NULL, NULL, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xbc);
LAB_001031be:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("bp = BIO_new(BIO_s_secmem())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x94);
LAB_001031e5:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_set_type_str(key1, algname, strlen(algname))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe4);
LAB_0010320c:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("d2i_PrivateKey_bio(bp, &pkey)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xa2);
LAB_00103233:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("hash = OPENSSL_zalloc(len)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x115);
LAB_0010325a:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("i2d_PrivateKey_bio(bp, priv_key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xb7);
LAB_00103281:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("sig2 = OPENSSL_malloc(siglen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x123);
  }
  else {
    iVar2 = EVP_PKEY_set_type(pEVar8,uVar14);
    if (iVar2 == 0) {
      ERR_print_errors_fp(_stderr);
      fprintf(_stderr,"Error at %s:%d %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c",
              0x84,"EVP_PKEY_set_type(pkey, type)");
      uVar15 = local_64;
      goto LAB_00102d69;
    }
    pEVar9 = EVP_PKEY_CTX_new(pEVar8,(ENGINE *)0x0);
    if (pEVar9 == (EVP_PKEY_CTX *)0x0) goto LAB_00102eb2;
    iVar2 = EVP_PKEY_keygen_init(pEVar9);
    if (iVar2 == 0) goto LAB_00102e64;
    iVar2 = EVP_PKEY_CTX_ctrl(pEVar9,uVar14,-1,0x1001,ptVar17->nid,(void *)0x0);
    if (iVar2 == 0) goto LAB_00102e8b;
    priv_key = (EVP_PKEY *)0x0;
    iVar2 = EVP_PKEY_keygen(pEVar9,(EVP_PKEY **)&priv_key);
    printf("\tEVP_PKEY_keygen:\t");
    print_test_result(iVar2);
    EVP_PKEY_CTX_free(pEVar9);
    EVP_PKEY_free((EVP_PKEY *)pkey);
    uVar15 = local_64;
    if (iVar2 != 1) goto LAB_00102d69;
    type = (BIO_METHOD *)BIO_s_secmem();
    bp = BIO_new(type);
    if (bp == (BIO *)0x0) goto LAB_001031be;
    iVar2 = PEM_write_bio_PrivateKey
                      (bp,(EVP_PKEY *)priv_key,(EVP_CIPHER *)0x0,(uchar *)0x0,0,(undefined1 *)0x0,
                       (void *)0x0);
    if (iVar2 == 0) goto LAB_001030fb;
    pkey = (EVP_PKEY *)0x0;
    pEVar8 = PEM_read_bio_PrivateKey(bp,(EVP_PKEY **)&pkey,(undefined1 *)0x0,(void *)0x0);
    if (pEVar8 == (EVP_PKEY *)0x0) goto LAB_00103038;
    printf("\tPEM_read_bio_PrivateKey:");
    iVar2 = EVP_PKEY_cmp((EVP_PKEY *)priv_key,(EVP_PKEY *)pkey);
    print_test_result((uint)(iVar2 != 0));
    EVP_PKEY_free((EVP_PKEY *)pkey);
    lVar10 = BIO_ctrl(bp,1,0,(void *)0x0);
    if ((int)lVar10 == 0) goto LAB_00102f9c;
    local_84 = uVar14;
    iVar3 = i2d_PrivateKey_bio(bp,(EVP_PKEY *)priv_key);
    if (iVar3 == 0) goto LAB_00102f00;
    pEVar8 = d2i_PrivateKey_bio(bp,(EVP_PKEY **)&pkey);
    if (pEVar8 == (EVP_PKEY *)0x0) goto LAB_0010320c;
    printf("\td2i_PrivateKey_bio:\t");
    iVar3 = EVP_PKEY_cmp((EVP_PKEY *)priv_key,(EVP_PKEY *)pkey);
    print_test_result((uint)(iVar3 != 0));
    EVP_PKEY_free((EVP_PKEY *)pkey);
    lVar10 = BIO_ctrl(bp,1,0,(void *)0x0);
    if ((int)lVar10 == 0) goto LAB_00103149;
    iVar4 = i2d_PrivateKey_bio(bp,(EVP_PKEY *)priv_key);
    if (iVar4 == 0) goto LAB_00103086;
    local_50 = ptVar17;
    lVar10 = d2i_PrivateKey_ex_bio(bp,&pkey,0);
    if (lVar10 == 0) goto LAB_00102fea;
    printf("\td2i_PrivateKey_ex_bio:\t");
    iVar4 = EVP_PKEY_cmp((EVP_PKEY *)priv_key,(EVP_PKEY *)pkey);
    print_test_result((uint)(iVar4 != 0));
    EVP_PKEY_free((EVP_PKEY *)pkey);
    lVar10 = BIO_ctrl(bp,1,0,(void *)0x0);
    if ((int)lVar10 == 0) goto LAB_00102f4e;
    iVar5 = i2d_PrivateKey_bio(bp,(EVP_PKEY *)priv_key);
    if (iVar5 == 0) goto LAB_0010325a;
    printf("\tOSSL_STORE_attach:\t");
    fflush(_stdout);
    pkey = (EVP_PKEY *)0x0;
    lVar10 = OSSL_STORE_attach(bp,"file",0,0,0,0,0,0,0);
    ptVar17 = local_50;
    uVar15 = local_84;
    if (lVar10 == 0) goto LAB_00103197;
    local_70 = local_70 >> 3;
    local_99 = (iVar2 == 0 || iVar3 == 0) || iVar4 == 0;
    while (lVar11 = OSSL_STORE_load(lVar10), lVar11 != 0) {
      iVar2 = OSSL_STORE_INFO_get_type(lVar11);
      if ((iVar2 == 4) &&
         (pkey = (EVP_PKEY *)OSSL_STORE_INFO_get1_PKEY(lVar11), pkey == (EVP_PKEY *)0x0)) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("(pkey = OSSL_STORE_INFO_get1_PKEY(info))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                    ,0xc5);
        goto LAB_00102e3d;
      }
      OSSL_STORE_INFO_free(lVar11);
    }
    ERR_print_errors_fp(_stderr);
    iVar2 = OSSL_STORE_eof(lVar10);
    if (iVar2 == 0) goto LAB_001030d4;
    OSSL_STORE_close(lVar10);
    if (pkey == (EVP_PKEY *)0x0) {
      puts("\x1b[1;36mskipped\x1b[m");
    }
    else {
      iVar2 = EVP_PKEY_cmp((EVP_PKEY *)priv_key,(EVP_PKEY *)pkey);
      print_test_result((uint)(iVar2 != 0));
      local_99 = local_99 || iVar2 == 0;
      EVP_PKEY_free((EVP_PKEY *)pkey);
    }
    BIO_free(bp);
    kptr = (uchar *)0x0;
    iVar2 = i2d_PrivateKey((EVP_PKEY *)priv_key,&kptr);
    if (iVar2 == 0) goto LAB_00103011;
    tptr = kptr;
    pkey = (EVP_PKEY *)0x0;
    pEVar8 = d2i_PrivateKey(uVar15,(EVP_PKEY **)&pkey,&tptr,(long)iVar2);
    if (pEVar8 == (EVP_PKEY *)0x0) goto LAB_00102f75;
    printf("\td2i_PrivateKey:\t\t");
    iVar2 = EVP_PKEY_cmp((EVP_PKEY *)priv_key,(EVP_PKEY *)pkey);
    print_test_result((uint)(iVar2 != 0));
    EVP_PKEY_free((EVP_PKEY *)pkey);
    CRYPTO_free(kptr);
    pEVar8 = EVP_PKEY_new();
    if (pEVar8 == (EVP_PKEY *)0x0) goto LAB_00102ed9;
    iVar3 = EVP_PKEY_set_type_str(pEVar8,pcVar18,0xc);
    if (iVar3 == 0) goto LAB_001031e5;
    pEVar9 = EVP_PKEY_CTX_new(pEVar8,(ENGINE *)0x0);
    if (pEVar9 == (EVP_PKEY_CTX *)0x0) goto LAB_00103122;
    iVar3 = EVP_PKEY_keygen_init(pEVar9);
    if (iVar3 == 0) goto LAB_0010305f;
    local_85 = iVar2 == 0;
    iVar2 = EVP_PKEY_CTX_ctrl_str(pEVar9,"paramset",ptVar17->paramset);
    if (iVar2 == 0) goto LAB_00102fc3;
    key2 = (EVP_PKEY *)0x0;
    iVar2 = EVP_PKEY_keygen(pEVar9,(EVP_PKEY **)&key2);
    printf("\tEVP_PKEY_*_str:\t\t");
    print_test_result(iVar2);
    local_86 = iVar2 == 0;
    val = EVP_PKEY_get_id(key2);
    printf("\tEVP_PKEY_id (%d):\t",(ulong)uVar15);
    print_test_tf((uint)(val == uVar15),val,"match","mismatch");
    key = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)key2);
    group = EC_KEY_get0_group(key);
    iVar2 = EC_GROUP_get_curve_name(group);
    uVar7 = (uint)(iVar2 == ptVar17->nid);
    printf("\tcurve_name (%d):\t");
    print_test_tf(uVar7,iVar2,"match","mismatch");
    iVar2 = EVP_PKEY_cmp_parameters((EVP_PKEY *)priv_key,(EVP_PKEY *)key2);
    printf("\tEVP_PKEY_cmp_parameters:");
    print_test_tf(iVar2,iVar2,"success","failure");
    local_84 = CONCAT31(local_84._1_3_,iVar2 != 1);
    uVar6 = EVP_PKEY_cmp((EVP_PKEY *)priv_key,(EVP_PKEY *)key2);
    uVar14 = (uint)(uVar6 == 0);
    if ((int)uVar6 < 0) {
      uVar14 = uVar6;
    }
    printf("\tEVP_PKEY_cmp:\t\t");
    print_test_tf(uVar14,uVar14,"differ (good)","equal (error)");
    EVP_PKEY_CTX_free(pEVar9);
    EVP_PKEY_free(pEVar8);
    iVar2 = EVP_PKEY_get_size(priv_key);
    local_80 = (size_t)iVar2;
    puVar12 = (uchar *)CRYPTO_malloc(iVar2,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                                     ,0x113);
    if (puVar12 == (uchar *)0x0) goto LAB_00102f27;
    local_87 = uVar14 != 1;
    puVar13 = (uchar *)CRYPTO_zalloc(local_70,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                                     ,0x115);
    if (puVar13 == (uchar *)0x0) goto LAB_00103233;
    pEVar9 = EVP_PKEY_CTX_new((EVP_PKEY *)priv_key,(ENGINE *)0x0);
    if (pEVar9 == (EVP_PKEY_CTX *)0x0) goto LAB_00103170;
    local_54 = uVar7;
    iVar2 = EVP_PKEY_sign_init(pEVar9);
    uVar1 = local_70;
    if (iVar2 == 0) goto LAB_001030ad;
    iVar2 = EVP_PKEY_sign(pEVar9,puVar12,&local_80,puVar13,local_70);
    printf("\tEVP_PKEY_sign:\t\t");
    print_test_result(iVar2);
    local_88 = iVar2 != 1;
    sig = (uchar *)CRYPTO_malloc((int)local_80,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                                 ,0x123);
    if (sig == (uchar *)0x0) goto LAB_00103281;
    local_40 = puVar13;
    iVar2 = EVP_PKEY_sign(pEVar9,sig,&local_80,puVar13,uVar1);
    if (iVar2 != 1) {
      ERR_print_errors_fp(_stderr);
      fprintf(_stderr,"Error at %s:%d %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c",
              0x124,"EVP_PKEY_sign(ctx, sig2, &siglen, hash, len) == 1");
      uVar7 = 0xffffffff;
      ptVar17 = local_50;
      uVar15 = local_64;
      goto LAB_00102d69;
    }
    printf("\tNon-determinism:\t");
    iVar2 = bcmp(puVar12,sig,local_80);
    print_test_result((uint)(iVar2 != 0));
    CRYPTO_free(sig);
    iVar3 = EVP_PKEY_verify_init(pEVar9);
    puVar13 = local_40;
    uVar1 = local_70;
    if (iVar3 == 0) goto LAB_001032cf;
    *local_40 = *local_40 + '\x01';
    local_48 = puVar12;
    iVar3 = EVP_PKEY_verify(pEVar9,puVar12,local_80,local_40,local_70);
    printf("\tEVP_PKEY_verify:\t");
    print_test_result(iVar3);
    iVar4 = EVP_PKEY_verify_init(pEVar9);
    puVar12 = local_48;
    if (iVar4 != 0) {
      bVar16 = val == uVar15 & (byte)local_54 ^ 1 | local_99 | local_85 | local_86 | (byte)local_84
               | local_87 | local_88;
      *puVar13 = *puVar13 + '\x01';
      uVar7 = EVP_PKEY_verify(pEVar9,local_48,local_80,puVar13,uVar1);
      uVar15 = (uint)(uVar7 == 0);
      if ((int)uVar7 < 0) {
        uVar15 = uVar7;
      }
      printf("\tFalse positive test:\t");
      print_test_result(uVar15);
      uVar7 = (uint)(byte)(uVar15 != 1 | (iVar3 != 1 || iVar2 == 0) | bVar16);
      EVP_PKEY_CTX_free(pEVar9);
      CRYPTO_free(puVar12);
      CRYPTO_free(puVar13);
      EVP_PKEY_free((EVP_PKEY *)priv_key);
      EVP_PKEY_free((EVP_PKEY *)key2);
      ptVar17 = local_50;
      uVar15 = local_64;
      goto LAB_00102d69;
    }
  }
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_PKEY_verify_init(ctx)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c",
              0x134);
LAB_001032cf:
  ERR_print_errors_fp(_stderr);
  iVar2 = 0x1047dd;
  OPENSSL_die("EVP_PKEY_verify_init(ctx)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c",
              300);
  if (iVar2 == 0) {
    iVar2 = puts("\x1b[1;31mfailure\x1b[m");
    return iVar2;
  }
  if (iVar2 != 1) {
    ERR_print_errors_fp(_stderr);
    return extraout_EAX;
  }
  iVar2 = puts("\x1b[1;32msuccess\x1b[m");
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;

    OPENSSL_add_all_algorithms_conf();

    struct test_sign *sp;
    for (sp = test_signs; sp->name; sp++)
	ret |= test_sign(sp);

    if (ret)
	printf(cDRED "= Some tests FAILED!" cNORM "\n");
    else
	printf(cDGREEN "= All tests passed!" cNORM "\n");
    return ret;
}